

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesDH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  BrotliEncoderDictionary *pBVar7;
  void *pvVar8;
  void *pvVar9;
  HasherCommon *pHVar10;
  PreparedDictionary *pPVar11;
  size_t sVar12;
  BrotliDictionary *pBVar13;
  int iVar14;
  byte bVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint *puVar20;
  size_t sVar21;
  ulong uVar22;
  byte bVar23;
  ulong uVar24;
  uint8_t *puVar25;
  ulong uVar26;
  ulong *puVar27;
  uint32_t uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint8_t *s1_orig_8;
  long lVar33;
  uint8_t *puVar34;
  ulong uVar35;
  ulong uVar36;
  char cVar37;
  bool bVar38;
  ushort uVar39;
  uint16_t uVar40;
  uint uVar41;
  ulong *puVar42;
  byte bVar43;
  ushort uVar44;
  uint uVar45;
  ulong uVar46;
  int iVar47;
  size_t sVar48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  size_t sVar52;
  ulong uVar53;
  ulong *puVar54;
  ulong uVar55;
  int iVar56;
  uint8_t *s1_orig_1;
  size_t sVar57;
  uint8_t *s1_orig_6;
  uint uVar58;
  size_t key;
  undefined8 *puVar59;
  uint32_t *addr;
  long lVar60;
  ulong *puVar61;
  ulong uVar62;
  ulong local_1a0;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  int local_144;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  Command *local_108;
  ulong local_100;
  ulong local_f8;
  uint local_e4;
  ulong local_d8;
  ulong local_a0;
  
  uVar4 = (position - 3) + num_bytes;
  sVar48 = position;
  if (3 < num_bytes) {
    sVar48 = uVar4;
  }
  lVar49 = 0x200;
  if (params->quality < 9) {
    lVar49 = 0x40;
  }
  local_130 = *last_insert_len;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 4) {
    local_108 = commands;
LAB_01d01130:
    *last_insert_len = (local_130 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_108 - (long)commands >> 4);
    return;
  }
  uVar30 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  sVar5 = params->stream_offset;
  sVar6 = (params->dictionary).compound.total_size;
  local_188 = lVar49 + position;
  lVar17 = sVar6 + 1;
  lVar3 = position - 1;
  local_108 = commands;
  uVar22 = position;
LAB_01cff5af:
  uVar19 = uVar30;
  if (uVar22 < uVar30) {
    uVar19 = uVar22;
  }
  uVar32 = sVar5 + uVar22;
  if (uVar30 <= sVar5 + uVar22) {
    uVar32 = uVar30;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_e4 = 0;
    local_a0 = 0;
    goto LAB_01cff642;
  }
  if (uVar22 == 0) {
    local_a0 = 0;
LAB_01cff61c:
    uVar46 = 0;
  }
  else {
    local_a0 = (ulong)ringbuffer[uVar22 - 1 & ringbuffer_mask];
    if (uVar22 == 1) goto LAB_01cff61c;
    uVar46 = (ulong)ringbuffer[uVar22 - 2 & ringbuffer_mask];
  }
  local_e4 = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar46 + 0x100] | literal_context_lut[local_a0]];
LAB_01cff642:
  local_170 = uVar1 - uVar22;
  pBVar7 = (params->dictionary).contextual.dict[local_e4];
  uVar46 = (params->dist).max_distance;
  pvVar8 = (hasher->privat)._H40.extra[0];
  pvVar9 = (hasher->privat)._H40.extra[1];
  uVar50 = uVar22 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar50);
  uVar41 = (uint)(*(int *)(ringbuffer + uVar50) * 0x1e35a7bd) >> 0x11;
  local_180 = 0x7e4;
  uVar31 = 0;
  lVar51 = 0;
  local_178 = 0;
  local_100 = 0;
LAB_01cff6c0:
  uVar55 = (ulong)dist_cache[lVar51];
  uVar24 = uVar22 - uVar55;
  cVar37 = (char)uVar41;
  if ((((lVar51 == 0) || (*(char *)((long)pvVar8 + (uVar24 & 0xffff) + 0x30000) == cVar37)) &&
      (uVar55 <= uVar19)) && (uVar24 < uVar22)) {
    puVar25 = ringbuffer + (uVar24 & ringbuffer_mask);
    uVar24 = local_170;
    puVar34 = puVar25;
    puVar61 = puVar2;
    if (7 < local_170) {
      lVar33 = 0;
      lVar18 = 0;
LAB_01cff71d:
      if (*(ulong *)((long)puVar2 + lVar33) == *(ulong *)(puVar25 + lVar33)) goto code_r0x01cff72a;
      uVar36 = *(ulong *)(puVar25 + lVar33) ^ *(ulong *)((long)puVar2 + lVar33);
      uVar24 = 0;
      if (uVar36 != 0) {
        for (; (uVar36 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar18;
      goto LAB_01cff7a6;
    }
    goto LAB_01cff75a;
  }
  goto LAB_01cff7f6;
code_r0x01cff72a:
  lVar33 = lVar33 + 8;
  lVar60 = local_170 + lVar18;
  lVar18 = lVar18 + -8;
  if (lVar60 - 8U < 8) goto code_r0x01cff744;
  goto LAB_01cff71d;
code_r0x01cff744:
  puVar34 = puVar25 + -lVar18;
  puVar61 = (ulong *)((long)puVar2 - lVar18);
  uVar24 = lVar18 + local_170;
LAB_01cff75a:
  if (uVar24 != 0) {
    uVar36 = 0;
    do {
      uVar62 = uVar36;
      if (puVar34[uVar36] != *(uint8_t *)((long)puVar61 + uVar36)) break;
      uVar36 = uVar36 + 1;
      uVar62 = uVar24;
    } while (uVar24 != uVar36);
    puVar34 = puVar34 + uVar62;
  }
  uVar24 = (long)puVar34 - (long)puVar25;
LAB_01cff7a6:
  if ((1 < uVar24) && (uVar36 = uVar24 * 0x87 + 0x78f, local_180 < uVar36)) {
    if (lVar51 != 0) {
      uVar36 = uVar36 - ((0x1ca10U >> ((byte)lVar51 & 2) & 4) + 0x27);
    }
    if (local_180 < uVar36) {
      local_100 = uVar55;
      uVar31 = uVar24;
      local_180 = uVar36;
      local_178 = uVar24;
    }
  }
LAB_01cff7f6:
  lVar51 = lVar51 + 1;
  if (lVar51 == 4) goto code_r0x01cff803;
  goto LAB_01cff6c0;
code_r0x01cff803:
  uVar24 = (ulong)uVar41;
  sVar52 = (hasher->privat)._H5.block_size_;
  uVar55 = uVar22 - *(uint *)((long)pvVar8 + uVar24 * 4);
  if (sVar52 != 0) {
    uVar44 = *(ushort *)((long)pvVar8 + uVar24 * 2 + 0x20000);
    uVar62 = 0;
    uVar36 = uVar55;
LAB_01cff841:
    uVar35 = (ulong)uVar44;
    uVar62 = uVar36 + uVar62;
    if (uVar62 <= uVar19) {
      if (uVar50 + uVar31 <= ringbuffer_mask) {
        uVar26 = uVar22 - uVar62 & ringbuffer_mask;
        uVar36 = uVar26 + uVar31;
        if ((ringbuffer_mask < uVar36) || (ringbuffer[uVar50 + uVar31] != ringbuffer[uVar36]))
        goto LAB_01cff985;
        puVar25 = ringbuffer + uVar26;
        puVar34 = puVar25;
        uVar36 = local_170;
        puVar61 = puVar2;
        if (7 < local_170) {
          lVar51 = 0;
          lVar18 = 0;
LAB_01cff8b4:
          if (*(ulong *)((long)puVar2 + lVar51) == *(ulong *)(puVar25 + lVar51))
          goto code_r0x01cff8c1;
          uVar26 = *(ulong *)(puVar25 + lVar51) ^ *(ulong *)((long)puVar2 + lVar51);
          uVar36 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
            }
          }
          uVar36 = (uVar36 >> 3 & 0x1fffffff) - lVar18;
          goto LAB_01cff945;
        }
        goto LAB_01cff8f4;
      }
      goto LAB_01cff985;
    }
  }
LAB_01cff99f:
  uVar44 = (hasher->privat)._H42.free_slot_idx[0];
  (hasher->privat)._H42.free_slot_idx[0] = uVar44 + 1;
  if (0xfffe < uVar55) {
    uVar55 = 0xffff;
  }
  *(char *)((long)pvVar8 + (uVar22 & 0xffff) + 0x30000) = cVar37;
  *(short *)((long)pvVar9 + (ulong)uVar44 * 4) = (short)uVar55;
  *(undefined2 *)((long)pvVar9 + (ulong)uVar44 * 4 + 2) =
       *(undefined2 *)((long)pvVar8 + uVar24 * 2 + 0x20000);
  *(int *)((long)pvVar8 + uVar24 * 4) = (int)uVar22;
  *(ushort *)((long)pvVar8 + uVar24 * 2 + 0x20000) = uVar44;
  local_144 = 0;
  uVar19 = local_180;
  local_f8 = local_178;
  if (local_180 == 0x7e4) {
    pHVar10 = (hasher->privat)._H5.common_;
    uVar31 = pHVar10->dict_num_lookups;
    local_180 = pHVar10->dict_num_matches;
    uVar19 = 0x7e4;
    if (uVar31 >> 7 <= local_180) {
      uVar24 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar34 = pBVar7->hash_table_lengths;
      uVar19 = 0x7e4;
      local_144 = 0;
      bVar38 = true;
LAB_01cffa97:
      uVar31 = uVar31 + 1;
      pHVar10->dict_num_lookups = uVar31;
      bVar23 = puVar34[uVar24];
      uVar55 = (ulong)bVar23;
      if ((uVar55 != 0) && (uVar55 <= local_170)) {
        pBVar13 = pBVar7->words;
        puVar27 = (ulong *)(pBVar13->data +
                           (ulong)pBVar13->offsets_by_length[uVar55] +
                           pBVar7->hash_table_words[uVar24] * uVar55);
        uVar36 = uVar55;
        puVar61 = puVar2;
        if (7 < bVar23) {
          lVar51 = 0;
LAB_01cffaf3:
          if (*puVar27 == *puVar61) goto code_r0x01cffaff;
          uVar62 = *puVar61 ^ *puVar27;
          uVar36 = 0;
          if (uVar62 != 0) {
            for (; (uVar62 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
            }
          }
          uVar36 = (uVar36 >> 3 & 0x1fffffff) - lVar51;
          goto LAB_01cffb5e;
        }
        goto LAB_01cffb26;
      }
      goto LAB_01cffc1e;
    }
  }
LAB_01cffc3b:
  local_178 = (params->dist).max_distance;
  sVar52 = (params->dictionary).compound.num_chunks;
  local_180 = uVar19;
  if (sVar52 != 0) {
    sVar57 = 0;
LAB_01cffc7e:
    pPVar11 = (params->dictionary).compound.chunks[sVar57];
    bVar23 = (byte)pPVar11->bucket_bits;
    bVar43 = (byte)pPVar11->slot_bits;
    bVar15 = -(char)pPVar11->hash_bits;
    uVar19 = ((*puVar2 << (bVar15 & 0x3f)) >> (bVar15 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar23 & 0x3f);
    lVar51 = (1L << (bVar43 & 0x3f)) * 4;
    lVar18 = (1L << (bVar23 & 0x3f)) * 2;
    bVar43 = -bVar43;
    puVar59 = (undefined8 *)
              ((long)&pPVar11[1].magic + (ulong)pPVar11->num_items * 4 + lVar18 + lVar51);
    if (pPVar11->magic != 0xdebcede0) {
      puVar59 = (undefined8 *)*puVar59;
    }
    uVar46 = (uVar32 + (params->dictionary).compound.total_size) -
             (params->dictionary).compound.chunk_offsets[sVar57];
    uVar31 = (ulong)pPVar11->source_size;
    uVar44 = *(ushort *)((long)&pPVar11[1].magic + (uVar19 & 0xffffffff) * 2 + lVar51);
    puVar20 = (uint *)((long)&pPVar11[1].magic +
                      (ulong)((uint)uVar44 +
                             (&pPVar11[1].magic)
                             [(uint)((int)uVar19 << (bVar43 & 0x1f)) >> (bVar43 & 0x1f)]) * 4 +
                      lVar18 + lVar51);
    lVar51 = 0;
    uVar19 = local_f8;
LAB_01cffd3c:
    uVar24 = (ulong)dist_cache[lVar51];
    if ((uVar46 - uVar31 < uVar24) && (uVar24 <= uVar46)) {
      uVar55 = uVar31 - (uVar46 - uVar24);
      if (local_170 <= uVar55) {
        uVar55 = local_170;
      }
      lVar33 = (uVar46 - uVar24) + (long)puVar59;
      lVar18 = lVar33;
      puVar61 = puVar2;
      if (7 < uVar55) {
        lVar60 = 0;
LAB_01cffd74:
        if (*(ulong *)((long)puVar2 + lVar60) == *(ulong *)(lVar33 + lVar60)) goto code_r0x01cffd81;
        uVar36 = *(ulong *)(lVar33 + lVar60) ^ *(ulong *)((long)puVar2 + lVar60);
        uVar55 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
          }
        }
        uVar55 = (uVar55 >> 3 & 0x1fffffff) + lVar60;
        goto LAB_01cffddd;
      }
      goto LAB_01cffd9e;
    }
    goto LAB_01cffe3d;
  }
LAB_01cfffb9:
  if (0x7e4 < local_180) {
    local_140 = (lVar3 + num_bytes) - uVar22;
    uVar19 = sVar5 + 1 + uVar22;
    iVar56 = 0;
    uVar32 = local_130;
    uVar44 = (hasher->privat)._H42.free_slot_idx[0];
LAB_01d00014:
    uVar46 = uVar30;
    if (uVar19 < uVar30) {
      uVar46 = uVar19;
    }
    local_170 = local_170 - 1;
    local_138 = local_f8 - 1;
    if (local_170 <= local_f8 - 1) {
      local_138 = local_170;
    }
    if (4 < params->quality) {
      local_138 = 0;
    }
    uVar31 = uVar22 + 1;
    uVar50 = uVar30;
    if (uVar31 < uVar30) {
      uVar50 = uVar31;
    }
    local_d8 = sVar5 + uVar22 + 1;
    if (uVar30 <= local_d8) {
      local_d8 = uVar30;
    }
    if ((params->dictionary).contextual.context_based != 0) {
      local_e4 = (uint)(params->dictionary).contextual.context_map
                       [literal_context_lut[local_a0 + 0x100] |
                        literal_context_lut[ringbuffer[uVar22 & ringbuffer_mask]]];
      local_a0 = (ulong)ringbuffer[uVar22 & ringbuffer_mask];
    }
    pBVar7 = (params->dictionary).contextual.dict[local_e4];
    pvVar8 = (hasher->privat)._H40.extra[0];
    pvVar9 = (hasher->privat)._H40.extra[1];
    uVar24 = uVar31 & ringbuffer_mask;
    puVar2 = (ulong *)(ringbuffer + uVar24);
    uVar41 = (uint)(*(int *)(ringbuffer + uVar24) * 0x1e35a7bd) >> 0x11;
    local_190 = 0x7e4;
    lVar51 = 0;
    local_1a0 = 0;
    local_188 = 0;
LAB_01d00144:
    uVar36 = (ulong)dist_cache[lVar51];
    uVar55 = uVar31 - uVar36;
    cVar37 = (char)uVar41;
    if (((lVar51 == 0) || (*(char *)((long)pvVar8 + (uVar55 & 0xffff) + 0x30000) == cVar37)) &&
       ((uVar36 <= uVar50 && (uVar55 < uVar31)))) {
      puVar25 = ringbuffer + (uVar55 & ringbuffer_mask);
      puVar61 = puVar2;
      puVar34 = puVar25;
      uVar55 = local_170;
      if (7 < local_170) {
        lVar18 = 0;
        lVar33 = 0;
LAB_01d0019a:
        if (*(ulong *)((long)puVar2 + lVar18) == *(ulong *)(puVar25 + lVar18))
        goto code_r0x01d001a7;
        uVar62 = *(ulong *)(puVar25 + lVar18) ^ *(ulong *)((long)puVar2 + lVar18);
        uVar55 = 0;
        if (uVar62 != 0) {
          for (; (uVar62 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
          }
        }
        uVar55 = (uVar55 >> 3 & 0x1fffffff) - lVar33;
        goto LAB_01d00227;
      }
      goto LAB_01d001d7;
    }
    goto LAB_01d00275;
  }
  local_130 = local_130 + 1;
  position = uVar22 + 1;
  if (position <= local_188) goto LAB_01d010bd;
  if ((uint)((int)lVar49 * 4) + local_188 < position) {
    uVar19 = uVar22 + 0x11;
    if (uVar1 - 4 <= uVar22 + 0x11) {
      uVar19 = uVar1 - 4;
    }
    if (uVar19 <= position) goto LAB_01d010bd;
    pvVar8 = (hasher->privat)._H40.extra[0];
    pvVar9 = (hasher->privat)._H40.extra[1];
    uVar44 = (hasher->privat)._H42.free_slot_idx[0];
    do {
      uVar41 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar22 = (ulong)uVar41;
      uVar32 = position - *(uint *)((long)pvVar8 + uVar22 * 4);
      *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar41;
      if (0xfffe < uVar32) {
        uVar32 = 0xffff;
      }
      uVar39 = uVar44 + 1;
      *(short *)((long)pvVar9 + (ulong)uVar44 * 4) = (short)uVar32;
      *(undefined2 *)((long)pvVar9 + (ulong)uVar44 * 4 + 2) =
           *(undefined2 *)((long)pvVar8 + uVar22 * 2 + 0x20000);
      *(int *)((long)pvVar8 + uVar22 * 4) = (int)position;
      *(ushort *)((long)pvVar8 + uVar22 * 2 + 0x20000) = uVar44;
      local_130 = local_130 + 4;
      position = position + 4;
      uVar44 = uVar39;
    } while (position < uVar19);
  }
  else {
    uVar19 = uVar22 + 9;
    if (uVar4 <= uVar22 + 9) {
      uVar19 = uVar4;
    }
    if (uVar19 <= position) goto LAB_01d010bd;
    pvVar8 = (hasher->privat)._H40.extra[0];
    pvVar9 = (hasher->privat)._H40.extra[1];
    uVar44 = (hasher->privat)._H42.free_slot_idx[0];
    do {
      uVar41 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar22 = (ulong)uVar41;
      uVar32 = position - *(uint *)((long)pvVar8 + uVar22 * 4);
      *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar41;
      if (0xfffe < uVar32) {
        uVar32 = 0xffff;
      }
      uVar39 = uVar44 + 1;
      *(short *)((long)pvVar9 + (ulong)uVar44 * 4) = (short)uVar32;
      *(undefined2 *)((long)pvVar9 + (ulong)uVar44 * 4 + 2) =
           *(undefined2 *)((long)pvVar8 + uVar22 * 2 + 0x20000);
      *(int *)((long)pvVar8 + uVar22 * 4) = (int)position;
      *(ushort *)((long)pvVar8 + uVar22 * 2 + 0x20000) = uVar44;
      local_130 = local_130 + 2;
      position = position + 2;
      uVar44 = uVar39;
    } while (position < uVar19);
  }
LAB_01d01099:
  (hasher->privat)._H42.free_slot_idx[0] = uVar39;
LAB_01d010bd:
  uVar22 = position;
  if (uVar1 <= position + 4) goto LAB_01d01130;
  goto LAB_01cff5af;
code_r0x01cff8c1:
  lVar51 = lVar51 + 8;
  lVar33 = local_170 + lVar18;
  lVar18 = lVar18 + -8;
  if (lVar33 - 8U < 8) goto code_r0x01cff8db;
  goto LAB_01cff8b4;
code_r0x01cff8db:
  puVar34 = puVar25 + -lVar18;
  puVar61 = (ulong *)((long)puVar2 - lVar18);
  uVar36 = lVar18 + local_170;
LAB_01cff8f4:
  if (uVar36 != 0) {
    uVar26 = 0;
    do {
      uVar53 = uVar26;
      if (puVar34[uVar26] != *(uint8_t *)((long)puVar61 + uVar26)) break;
      uVar26 = uVar26 + 1;
      uVar53 = uVar36;
    } while (uVar36 != uVar26);
    puVar34 = puVar34 + uVar53;
  }
  uVar36 = (long)puVar34 - (long)puVar25;
LAB_01cff945:
  if (3 < uVar36) {
    iVar56 = 0x1f;
    if ((uint)uVar62 != 0) {
      for (; (uint)uVar62 >> iVar56 == 0; iVar56 = iVar56 + -1) {
      }
    }
    uVar26 = (ulong)(iVar56 * -0x1e + 0x780) + uVar36 * 0x87;
    if (local_180 < uVar26) {
      local_100 = uVar62;
      uVar31 = uVar36;
      local_180 = uVar26;
      local_178 = uVar36;
    }
  }
LAB_01cff985:
  uVar44 = *(ushort *)((long)pvVar9 + uVar35 * 4 + 2);
  uVar36 = (ulong)*(ushort *)((long)pvVar9 + uVar35 * 4);
  sVar52 = sVar52 - 1;
  if (sVar52 == 0) goto LAB_01cff99f;
  goto LAB_01cff841;
code_r0x01cffaff:
  puVar27 = puVar27 + 1;
  puVar61 = puVar61 + 1;
  lVar18 = uVar55 + lVar51;
  lVar51 = lVar51 + -8;
  if (lVar18 - 8U < 8) goto code_r0x01cffb19;
  goto LAB_01cffaf3;
code_r0x01cffb19:
  uVar36 = lVar51 + uVar55;
  if (lVar51 + uVar55 != 0) {
LAB_01cffb26:
    uVar62 = 0;
    do {
      uVar35 = uVar62;
      if (*(char *)((long)puVar61 + uVar62) != *(char *)((long)puVar27 + uVar62)) break;
      uVar62 = uVar62 + 1;
      uVar35 = uVar36;
    } while (uVar36 != uVar62);
    puVar61 = (ulong *)(uVar35 + (long)puVar61);
  }
  uVar36 = (long)puVar61 - (long)puVar2;
LAB_01cffb5e:
  if (((uVar36 != 0) && (uVar55 < pBVar7->cutoffTransformsCount + uVar36)) &&
     (uVar55 = (ulong)pBVar7->hash_table_words[uVar24] + lVar17 + uVar32 +
               ((ulong)((uint)(pBVar7->cutoffTransforms >>
                              ((char)(uVar55 - uVar36) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar55 - uVar36) * 4 << (pBVar13->size_bits_by_length[uVar55] & 0x3f)),
     uVar55 <= uVar46)) {
    iVar56 = 0x1f;
    if ((uint)uVar55 != 0) {
      for (; (uint)uVar55 >> iVar56 == 0; iVar56 = iVar56 + -1) {
      }
    }
    uVar62 = (uVar36 * 0x87 - (ulong)(uint)(iVar56 * 0x1e)) + 0x780;
    if (uVar19 <= uVar62) {
      local_144 = (uint)bVar23 - (int)uVar36;
      local_180 = local_180 + 1;
      pHVar10->dict_num_matches = local_180;
      uVar19 = uVar62;
      local_100 = uVar55;
      local_178 = uVar36;
    }
  }
LAB_01cffc1e:
  uVar24 = uVar24 + 1;
  bVar16 = !bVar38;
  local_f8 = local_178;
  bVar38 = false;
  if (bVar16) goto LAB_01cffc3b;
  goto LAB_01cffa97;
code_r0x01cffd81:
  uVar55 = uVar55 - 8;
  lVar60 = lVar60 + 8;
  if (uVar55 < 8) goto code_r0x01cffd8f;
  goto LAB_01cffd74;
code_r0x01cffd8f:
  lVar18 = lVar33 + lVar60;
  puVar61 = (ulong *)(lVar60 + (long)puVar2);
LAB_01cffd9e:
  if (uVar55 != 0) {
    uVar36 = 0;
    do {
      uVar62 = uVar36;
      if (*(char *)(lVar18 + uVar36) != *(char *)((long)puVar61 + uVar36)) break;
      uVar36 = uVar36 + 1;
      uVar62 = uVar55;
    } while (uVar55 != uVar36);
    lVar18 = lVar18 + uVar62;
  }
  uVar55 = lVar18 - lVar33;
LAB_01cffddd:
  if ((1 < uVar55) && (uVar36 = uVar55 * 0x87 + 0x78f, local_180 < uVar36)) {
    if (lVar51 != 0) {
      uVar36 = uVar36 - ((0x1ca10U >> ((byte)lVar51 & 2) & 4) + 0x27);
    }
    if (local_180 < uVar36) {
      if (uVar19 < uVar55) {
        uVar19 = uVar55;
      }
      local_144 = 0;
      local_180 = uVar36;
      local_100 = uVar24;
      local_f8 = uVar55;
    }
  }
LAB_01cffe3d:
  lVar51 = lVar51 + 1;
  if (lVar51 == 4) goto code_r0x01cffe4a;
  goto LAB_01cffd3c;
code_r0x01cffe4a:
  if (uVar44 != 0xffff) {
LAB_01cfff64:
    uVar41 = *puVar20;
    uVar55 = (ulong)(uVar41 & 0x7fffffff);
    uVar36 = uVar46 - uVar55;
    uVar24 = uVar31 - uVar55;
    if (local_170 <= uVar31 - uVar55) {
      uVar24 = local_170;
    }
    if ((((uVar36 <= local_178) && (uVar50 + uVar19 <= ringbuffer_mask)) && (uVar19 < uVar24)) &&
       (ringbuffer[uVar50 + uVar19] == *(uint8_t *)((long)puVar59 + uVar55 + uVar19))) {
      puVar54 = (ulong *)(uVar55 + (long)puVar59);
      puVar61 = puVar54;
      puVar27 = puVar2;
      if (7 < uVar24) {
        lVar51 = 0;
        puVar42 = puVar54;
LAB_01cffea4:
        if (*puVar27 == *puVar42) goto code_r0x01cffeaf;
        uVar55 = *puVar42 ^ *puVar27;
        uVar24 = 0;
        if (uVar55 != 0) {
          for (; (uVar55 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar51;
        goto LAB_01cfff1a;
      }
      goto LAB_01cffede;
    }
    goto LAB_01cfff91;
  }
LAB_01cfff99:
  sVar57 = sVar57 + 1;
  if (sVar57 == sVar52) goto LAB_01cfffb9;
  goto LAB_01cffc7e;
code_r0x01cffeaf:
  puVar27 = puVar27 + 1;
  puVar42 = puVar42 + 1;
  lVar18 = uVar24 + lVar51;
  lVar51 = lVar51 + -8;
  if (lVar18 - 8U < 8) goto code_r0x01cffec9;
  goto LAB_01cffea4;
code_r0x01cffec9:
  uVar24 = uVar24 + lVar51;
  puVar61 = puVar42;
  if (uVar24 != 0) {
LAB_01cffede:
    puVar42 = (ulong *)((long)puVar61 + uVar24);
    uVar55 = 0;
    do {
      if (*(char *)((long)puVar61 + uVar55) != *(char *)((long)puVar27 + uVar55)) {
        puVar42 = (ulong *)((long)puVar61 + uVar55);
        break;
      }
      uVar55 = uVar55 + 1;
    } while (uVar24 != uVar55);
  }
  uVar24 = (long)puVar42 - (long)puVar54;
LAB_01cfff1a:
  if (3 < uVar24) {
    iVar56 = 0x1f;
    if ((uint)uVar36 != 0) {
      for (; (uint)uVar36 >> iVar56 == 0; iVar56 = iVar56 + -1) {
      }
    }
    uVar55 = (ulong)(iVar56 * -0x1e + 0x780) + uVar24 * 0x87;
    if (local_180 < uVar55) {
      local_144 = 0;
      uVar19 = uVar24;
      local_180 = uVar55;
      local_100 = uVar36;
      local_f8 = uVar24;
    }
  }
LAB_01cfff91:
  puVar20 = puVar20 + 1;
  if ((int)uVar41 < 0) goto LAB_01cfff99;
  goto LAB_01cfff64;
code_r0x01d001a7:
  lVar18 = lVar18 + 8;
  lVar60 = local_140 + lVar33;
  lVar33 = lVar33 + -8;
  if (lVar60 - 8U < 8) goto code_r0x01d001c1;
  goto LAB_01d0019a;
code_r0x01d001c1:
  puVar34 = puVar25 + -lVar33;
  puVar61 = (ulong *)((long)puVar2 - lVar33);
  uVar55 = lVar33 + local_140;
LAB_01d001d7:
  if (uVar55 != 0) {
    uVar62 = 0;
    do {
      uVar35 = uVar62;
      if (puVar34[uVar62] != *(uint8_t *)((long)puVar61 + uVar62)) break;
      uVar62 = uVar62 + 1;
      uVar35 = uVar55;
    } while (uVar55 != uVar62);
    puVar34 = puVar34 + uVar35;
  }
  uVar55 = (long)puVar34 - (long)puVar25;
LAB_01d00227:
  if ((1 < uVar55) && (uVar62 = uVar55 * 0x87 + 0x78f, local_190 < uVar62)) {
    if (lVar51 != 0) {
      uVar62 = uVar62 - ((0x1ca10U >> ((byte)lVar51 & 2) & 4) + 0x27);
    }
    if (local_190 < uVar62) {
      local_188 = uVar36;
      local_1a0 = uVar55;
      local_190 = uVar62;
      local_138 = uVar55;
    }
  }
LAB_01d00275:
  lVar51 = lVar51 + 1;
  if (lVar51 == 4) goto code_r0x01d00287;
  goto LAB_01d00144;
code_r0x01d00287:
  uVar36 = (ulong)uVar41;
  sVar52 = (hasher->privat)._H5.block_size_;
  uVar55 = uVar31 - *(uint *)((long)pvVar8 + uVar36 * 4);
  if (sVar52 != 0) {
    uVar39 = *(ushort *)((long)pvVar8 + uVar36 * 2 + 0x20000);
    uVar35 = 0;
    uVar62 = uVar55;
LAB_01d002b9:
    uVar35 = uVar62 + uVar35;
    if (uVar35 <= uVar50) {
      if (uVar24 + local_138 <= ringbuffer_mask) {
        uVar26 = uVar31 - uVar35 & ringbuffer_mask;
        uVar62 = local_138 + uVar26;
        if ((ringbuffer_mask < uVar62) || (ringbuffer[uVar24 + local_138] != ringbuffer[uVar62]))
        goto LAB_01d00397;
        puVar25 = ringbuffer + uVar26;
        puVar61 = puVar2;
        puVar34 = puVar25;
        uVar62 = local_170;
        if (7 < local_170) {
          lVar51 = 0;
          lVar18 = 0;
LAB_01d00329:
          if (*(ulong *)((long)puVar2 + lVar51) == *(ulong *)(puVar25 + lVar51))
          goto code_r0x01d00336;
          uVar26 = *(ulong *)(puVar25 + lVar51) ^ *(ulong *)((long)puVar2 + lVar51);
          uVar62 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
            }
          }
          uVar62 = (uVar62 >> 3 & 0x1fffffff) - lVar18;
          goto LAB_01d003e3;
        }
        goto LAB_01d0036a;
      }
      goto LAB_01d00397;
    }
  }
LAB_01d00421:
  (hasher->privat)._H42.free_slot_idx[0] = uVar44 + 1;
  *(char *)((long)pvVar8 + (uVar31 & 0xffff) + 0x30000) = cVar37;
  if (0xfffe < uVar55) {
    uVar55 = 0xffff;
  }
  *(short *)((long)pvVar9 + (ulong)uVar44 * 4) = (short)uVar55;
  *(undefined2 *)((long)pvVar9 + (ulong)uVar44 * 4 + 2) =
       *(undefined2 *)((long)pvVar8 + uVar36 * 2 + 0x20000);
  *(int *)((long)pvVar8 + uVar36 * 4) = (int)uVar31;
  *(ushort *)((long)pvVar8 + uVar36 * 2 + 0x20000) = uVar44;
  iVar47 = 0;
  uVar50 = local_1a0;
  if (local_190 == 0x7e4) {
    pHVar10 = (hasher->privat)._H5.common_;
    uVar55 = pHVar10->dict_num_lookups;
    local_168 = pHVar10->dict_num_matches;
    local_190 = 0x7e4;
    uVar50 = local_1a0;
    if (uVar55 >> 7 <= local_168) {
      uVar36 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar34 = pBVar7->hash_table_lengths;
      iVar47 = 0;
      local_190 = 0x7e4;
      bVar38 = true;
LAB_01d0098d:
      uVar55 = uVar55 + 1;
      pHVar10->dict_num_lookups = uVar55;
      bVar23 = puVar34[uVar36];
      uVar50 = (ulong)bVar23;
      if ((uVar50 != 0) && (uVar50 <= local_170)) {
        pBVar13 = pBVar7->words;
        puVar27 = (ulong *)(pBVar13->data +
                           (ulong)pBVar13->offsets_by_length[uVar50] +
                           pBVar7->hash_table_words[uVar36] * uVar50);
        puVar61 = puVar2;
        uVar62 = uVar50;
        if (7 < bVar23) {
          lVar51 = 0;
LAB_01d009e9:
          if (*puVar27 == *puVar61) goto code_r0x01d009f4;
          uVar35 = *puVar61 ^ *puVar27;
          uVar62 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
            }
          }
          uVar62 = (uVar62 >> 3 & 0x1fffffff) - lVar51;
          goto LAB_01d00a57;
        }
        goto LAB_01d00a1b;
      }
      goto LAB_01d00aff;
    }
  }
LAB_01d004c9:
  local_168 = uVar50;
  local_178 = (params->dist).max_distance;
  sVar52 = (params->dictionary).compound.num_chunks;
  if (sVar52 != 0) {
    sVar57 = (params->dictionary).compound.total_size;
    sVar21 = 0;
LAB_01d0051d:
    pPVar11 = (params->dictionary).compound.chunks[sVar21];
    bVar23 = (byte)pPVar11->bucket_bits;
    bVar43 = (byte)pPVar11->slot_bits;
    bVar15 = -(char)pPVar11->hash_bits;
    uVar50 = ((*puVar2 << (bVar15 & 0x3f)) >> (bVar15 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar23 & 0x3f);
    lVar51 = (1L << (bVar43 & 0x3f)) * 4;
    lVar18 = (1L << (bVar23 & 0x3f)) * 2;
    bVar43 = -bVar43;
    puVar59 = (undefined8 *)
              ((long)&pPVar11[1].magic + (ulong)pPVar11->num_items * 4 + lVar18 + lVar51);
    if (pPVar11->magic != 0xdebcede0) {
      puVar59 = (undefined8 *)*puVar59;
    }
    sVar12 = (params->dictionary).compound.chunk_offsets[sVar21];
    uVar55 = (local_d8 + sVar57) - sVar12;
    uVar36 = (ulong)pPVar11->source_size;
    uVar39 = *(ushort *)((long)&pPVar11[1].magic + (uVar50 & 0xffffffff) * 2 + lVar51);
    puVar20 = (uint *)((long)&pPVar11[1].magic +
                      (ulong)((uint)uVar39 +
                             (&pPVar11[1].magic)
                             [(uint)((int)uVar50 << (bVar43 & 0x1f)) >> (bVar43 & 0x1f)]) * 4 +
                      lVar18 + lVar51);
    lVar51 = 0;
    uVar50 = local_168;
LAB_01d005f2:
    uVar62 = (ulong)dist_cache[lVar51];
    if ((uVar55 - uVar36 < uVar62) && (uVar62 <= uVar55)) {
      uVar35 = uVar36 - (uVar55 - uVar62);
      if (local_170 <= uVar35) {
        uVar35 = local_170;
      }
      lVar33 = (uVar55 - uVar62) + (long)puVar59;
      lVar18 = lVar33;
      puVar61 = puVar2;
      if (7 < uVar35) {
        lVar18 = ((uVar46 + sVar57) - sVar12) - uVar62;
        lVar60 = 0;
LAB_01d00632:
        uVar26 = *(ulong *)((long)puVar59 + lVar60 + lVar18);
        if (*(ulong *)((long)puVar2 + lVar60) == uVar26) goto code_r0x01d0063f;
        uVar26 = uVar26 ^ *(ulong *)((long)puVar2 + lVar60);
        uVar35 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        uVar35 = (uVar35 >> 3 & 0x1fffffff) + lVar60;
        goto LAB_01d006ac;
      }
      goto LAB_01d00663;
    }
    goto LAB_01d0070c;
  }
LAB_01d008b2:
  uVar46 = local_180 + 0xaf;
  local_180 = local_190;
  if (local_190 < uVar46) {
    uVar46 = uVar32;
    local_168 = local_f8;
    uVar31 = uVar22;
    iVar47 = local_144;
    local_d8 = uVar22 + sVar5;
    if (uVar30 <= uVar22 + sVar5) {
      local_d8 = uVar30;
    }
    goto LAB_01d00c8c;
  }
  uVar46 = local_130 + 4;
  local_100 = local_188;
  if (iVar56 == 3) goto LAB_01d00c8c;
  uVar46 = uVar32 + 1;
  iVar56 = iVar56 + 1;
  uVar50 = uVar22 + 5;
  local_140 = local_140 - 1;
  uVar19 = uVar19 + 1;
  uVar32 = uVar46;
  uVar22 = uVar31;
  local_f8 = local_168;
  local_144 = iVar47;
  uVar44 = uVar44 + 1;
  if (uVar1 <= uVar50) goto LAB_01d00c8c;
  goto LAB_01d00014;
code_r0x01d00336:
  lVar51 = lVar51 + 8;
  lVar33 = local_140 + lVar18;
  lVar18 = lVar18 + -8;
  if (lVar33 - 8U < 8) goto code_r0x01d00351;
  goto LAB_01d00329;
code_r0x01d00351:
  puVar34 = puVar25 + -lVar18;
  puVar61 = (ulong *)((long)puVar2 - lVar18);
  uVar62 = lVar18 + local_140;
LAB_01d0036a:
  if (uVar62 != 0) {
    uVar26 = 0;
    do {
      uVar53 = uVar26;
      if (puVar34[uVar26] != *(uint8_t *)((long)puVar61 + uVar26)) break;
      uVar26 = uVar26 + 1;
      uVar53 = uVar62;
    } while (uVar62 != uVar26);
    puVar34 = puVar34 + uVar53;
  }
  uVar62 = (long)puVar34 - (long)puVar25;
LAB_01d003e3:
  if (3 < uVar62) {
    iVar47 = 0x1f;
    if ((uint)uVar35 != 0) {
      for (; (uint)uVar35 >> iVar47 == 0; iVar47 = iVar47 + -1) {
      }
    }
    uVar26 = (ulong)(iVar47 * -0x1e + 0x780) + uVar62 * 0x87;
    if (local_190 < uVar26) {
      local_188 = uVar35;
      local_1a0 = uVar62;
      local_190 = uVar26;
      local_138 = uVar62;
    }
  }
LAB_01d00397:
  uVar62 = (ulong)uVar39;
  uVar39 = *(ushort *)((long)pvVar9 + uVar62 * 4 + 2);
  uVar62 = (ulong)*(ushort *)((long)pvVar9 + uVar62 * 4);
  sVar52 = sVar52 - 1;
  if (sVar52 == 0) goto LAB_01d00421;
  goto LAB_01d002b9;
code_r0x01d009f4:
  puVar27 = puVar27 + 1;
  puVar61 = puVar61 + 1;
  lVar18 = uVar50 + lVar51;
  lVar51 = lVar51 + -8;
  if (lVar18 - 8U < 8) goto code_r0x01d00a0e;
  goto LAB_01d009e9;
code_r0x01d00a0e:
  uVar62 = lVar51 + uVar50;
  if (lVar51 + uVar50 != 0) {
LAB_01d00a1b:
    uVar35 = 0;
    do {
      uVar26 = uVar35;
      if (*(char *)((long)puVar61 + uVar35) != *(char *)((long)puVar27 + uVar35)) break;
      uVar35 = uVar35 + 1;
      uVar26 = uVar62;
    } while (uVar62 != uVar35);
    puVar61 = (ulong *)((long)puVar61 + uVar26);
  }
  uVar62 = (long)puVar61 - (long)puVar2;
LAB_01d00a57:
  if (((uVar62 != 0) && (uVar50 < pBVar7->cutoffTransformsCount + uVar62)) &&
     (uVar50 = (ulong)pBVar7->hash_table_words[uVar36] + lVar17 + local_d8 +
               ((ulong)((uint)(pBVar7->cutoffTransforms >>
                              ((char)(uVar50 - uVar62) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar50 - uVar62) * 4 << (pBVar13->size_bits_by_length[uVar50] & 0x3f)),
     uVar50 <= local_178)) {
    iVar14 = 0x1f;
    if ((uint)uVar50 != 0) {
      for (; (uint)uVar50 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar35 = (uVar62 * 0x87 - (ulong)(uint)(iVar14 * 0x1e)) + 0x780;
    if (local_190 <= uVar35) {
      iVar47 = (uint)bVar23 - (int)uVar62;
      local_168 = local_168 + 1;
      pHVar10->dict_num_matches = local_168;
      local_188 = uVar50;
      local_1a0 = uVar62;
      local_190 = uVar35;
    }
  }
LAB_01d00aff:
  uVar36 = uVar36 + 1;
  bVar16 = !bVar38;
  uVar50 = local_1a0;
  bVar38 = false;
  if (bVar16) goto LAB_01d004c9;
  goto LAB_01d0098d;
code_r0x01d0063f:
  uVar35 = uVar35 - 8;
  lVar60 = lVar60 + 8;
  if (uVar35 < 8) goto code_r0x01d0064d;
  goto LAB_01d00632;
code_r0x01d0064d:
  lVar18 = (long)puVar59 + lVar60 + lVar18;
  puVar61 = (ulong *)(lVar60 + (long)puVar2);
LAB_01d00663:
  if (uVar35 != 0) {
    uVar26 = 0;
    do {
      uVar53 = uVar26;
      if (*(char *)(lVar18 + uVar26) != *(char *)((long)puVar61 + uVar26)) break;
      uVar26 = uVar26 + 1;
      uVar53 = uVar35;
    } while (uVar35 != uVar26);
    lVar18 = lVar18 + uVar53;
  }
  uVar35 = lVar18 - lVar33;
LAB_01d006ac:
  if ((1 < uVar35) && (uVar26 = uVar35 * 0x87 + 0x78f, local_190 < uVar26)) {
    if (lVar51 != 0) {
      uVar26 = uVar26 - ((0x1ca10U >> ((byte)lVar51 & 2) & 4) + 0x27);
    }
    if (local_190 < uVar26) {
      if (uVar50 < uVar35) {
        uVar50 = uVar35;
      }
      iVar47 = 0;
      local_190 = uVar26;
      local_188 = uVar62;
      local_168 = uVar35;
    }
  }
LAB_01d0070c:
  lVar51 = lVar51 + 1;
  if (lVar51 == 4) goto code_r0x01d00719;
  goto LAB_01d005f2;
code_r0x01d00719:
  if (uVar39 != 0xffff) {
LAB_01d00725:
    uVar41 = *puVar20;
    uVar53 = (ulong)(uVar41 & 0x7fffffff);
    uVar26 = uVar55 - uVar53;
    uVar62 = uVar36 - uVar53;
    uVar35 = local_170;
    if (uVar62 < local_170) {
      uVar35 = uVar62;
    }
    if ((((uVar26 <= local_178) && (uVar24 + uVar50 <= ringbuffer_mask)) && (uVar50 < uVar35)) &&
       (ringbuffer[uVar24 + uVar50] == *(uint8_t *)((long)puVar59 + uVar50 + uVar53))) {
      puVar54 = (ulong *)(uVar53 + (long)puVar59);
      puVar61 = puVar54;
      puVar27 = puVar2;
      if (7 < uVar35) {
        uVar35 = uVar62;
        if (local_140 < uVar62) {
          uVar35 = local_140;
        }
        lVar51 = 0;
        puVar42 = puVar54;
LAB_01d007ac:
        if (*puVar27 == *puVar42) goto code_r0x01d007b7;
        uVar35 = *puVar42 ^ *puVar27;
        uVar62 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
          }
        }
        uVar62 = (uVar62 >> 3 & 0x1fffffff) - lVar51;
        goto LAB_01d00828;
      }
      goto LAB_01d007ed;
    }
    goto LAB_01d00750;
  }
LAB_01d00881:
  sVar21 = sVar21 + 1;
  if (sVar21 == sVar52) goto LAB_01d008b2;
  goto LAB_01d0051d;
code_r0x01d007b7:
  puVar27 = puVar27 + 1;
  puVar42 = puVar42 + 1;
  lVar18 = lVar51 + uVar35;
  lVar51 = lVar51 + -8;
  if (lVar18 - 8U < 8) goto code_r0x01d007d1;
  goto LAB_01d007ac;
code_r0x01d007d1:
  if (local_140 < uVar62) {
    uVar62 = local_140;
  }
  uVar35 = uVar62 + lVar51;
  puVar61 = puVar42;
  if (uVar35 != 0) {
LAB_01d007ed:
    puVar42 = (ulong *)((long)puVar61 + uVar35);
    uVar62 = 0;
    do {
      if (*(char *)((long)puVar61 + uVar62) != *(char *)((long)puVar27 + uVar62)) {
        puVar42 = (ulong *)((long)puVar61 + uVar62);
        break;
      }
      uVar62 = uVar62 + 1;
    } while (uVar35 != uVar62);
  }
  uVar62 = (long)puVar42 - (long)puVar54;
LAB_01d00828:
  if (3 < uVar62) {
    iVar14 = 0x1f;
    if ((uint)uVar26 != 0) {
      for (; (uint)uVar26 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar35 = (ulong)(iVar14 * -0x1e + 0x780) + uVar62 * 0x87;
    if (local_190 < uVar35) {
      iVar47 = 0;
      uVar50 = uVar62;
      local_190 = uVar35;
      local_188 = uVar26;
      local_168 = uVar62;
    }
  }
LAB_01d00750:
  puVar20 = puVar20 + 1;
  if ((int)uVar41 < 0) goto LAB_01d00881;
  goto LAB_01d00725;
LAB_01d00c8c:
  local_d8 = local_d8 + sVar6;
  if (local_d8 < local_100) {
LAB_01d00cac:
    uVar22 = local_100 + 0xf;
LAB_01d00cb0:
    if ((local_100 <= local_d8) && (uVar22 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = (int)local_100;
    }
  }
  else {
    if (local_100 != (long)*dist_cache) {
      uVar22 = 1;
      if (local_100 != (long)dist_cache[1]) {
        uVar22 = (local_100 + 3) - (long)*dist_cache;
        if (uVar22 < 7) {
          bVar23 = (byte)((int)uVar22 << 2);
          uVar41 = 0x9750468;
        }
        else {
          uVar22 = (local_100 + 3) - (long)dist_cache[1];
          if (6 < uVar22) {
            uVar22 = 2;
            if ((local_100 != (long)dist_cache[2]) && (uVar22 = 3, local_100 != (long)dist_cache[3])
               ) goto LAB_01d00cac;
            goto LAB_01d00cb0;
          }
          bVar23 = (byte)((int)uVar22 << 2);
          uVar41 = 0xfdb1ace;
        }
        uVar22 = (ulong)(uVar41 >> (bVar23 & 0x1f) & 0xf);
      }
      goto LAB_01d00cb0;
    }
    uVar22 = 0;
  }
  uVar41 = (uint)uVar46;
  local_108->insert_len_ = uVar41;
  local_108->copy_len_ = iVar47 << 0x19 | (uint)local_168;
  uVar32 = (ulong)(params->dist).num_direct_distance_codes;
  uVar19 = uVar32 + 0x10;
  uVar28 = 0;
  if (uVar19 <= uVar22) {
    uVar58 = (params->dist).distance_postfix_bits;
    bVar23 = (byte)uVar58;
    uVar32 = ((4L << (bVar23 & 0x3f)) + (uVar22 - uVar32)) - 0x10;
    uVar45 = 0x1f;
    uVar29 = (uint)uVar32;
    if (uVar29 != 0) {
      for (; uVar29 >> uVar45 == 0; uVar45 = uVar45 - 1) {
      }
    }
    uVar45 = (uVar45 ^ 0xffffffe0) + 0x1f;
    uVar50 = (ulong)((uVar32 >> ((ulong)uVar45 & 0x3f) & 1) != 0);
    lVar51 = (ulong)uVar45 - (ulong)uVar58;
    uVar22 = (~(-1 << (bVar23 & 0x1f)) & uVar29) + uVar19 +
             (uVar50 + lVar51 * 2 + 0xfffe << (bVar23 & 0x3f)) | lVar51 * 0x400;
    uVar28 = (uint32_t)(uVar32 - (uVar50 + 2 << ((byte)uVar45 & 0x3f)) >> (bVar23 & 0x3f));
  }
  local_108->dist_prefix_ = (uint16_t)uVar22;
  local_108->dist_extra_ = uVar28;
  if (5 < uVar46) {
    if (uVar46 < 0x82) {
      uVar41 = 0x1f;
      uVar58 = (uint)(uVar46 - 2);
      if (uVar58 != 0) {
        for (; uVar58 >> uVar41 == 0; uVar41 = uVar41 - 1) {
        }
      }
      uVar41 = (int)(uVar46 - 2 >> ((char)(uVar41 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar41 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar46 < 0x842) {
      uVar58 = 0x1f;
      if (uVar41 - 0x42 != 0) {
        for (; uVar41 - 0x42 >> uVar58 == 0; uVar58 = uVar58 - 1) {
        }
      }
      uVar41 = (uVar58 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar41 = 0x15;
      if (0x1841 < uVar46) {
        uVar41 = (uint)(ushort)(0x17 - (uVar46 < 0x5842));
      }
    }
  }
  uVar58 = iVar47 + (uint)local_168;
  if (uVar58 < 10) {
    uVar45 = uVar58 - 2;
  }
  else if (uVar58 < 0x86) {
    uVar58 = uVar58 - 6;
    uVar45 = 0x1f;
    if (uVar58 != 0) {
      for (; uVar58 >> uVar45 == 0; uVar45 = uVar45 - 1) {
      }
    }
    uVar45 = (uVar58 >> ((char)(uVar45 ^ 0xffffffe0) + 0x1fU & 0x1f)) + 0x42 +
             (uVar45 ^ 0xffffffe0) * 2;
  }
  else {
    uVar45 = 0x17;
    if (uVar58 < 0x846) {
      uVar45 = 0x1f;
      if (uVar58 - 0x46 != 0) {
        for (; uVar58 - 0x46 >> uVar45 == 0; uVar45 = uVar45 - 1) {
        }
      }
      uVar45 = (uVar45 ^ 0xffe0) + 0x2c;
    }
  }
  uVar44 = (ushort)uVar45;
  uVar40 = (uVar44 & 7) + ((ushort)uVar41 & 7) * 8;
  if ((((uVar22 & 0x3ff) == 0) && ((ushort)uVar41 < 8)) && (uVar44 < 0x10)) {
    if (7 < uVar44) {
      uVar40 = uVar40 + 0x40;
    }
  }
  else {
    iVar56 = ((uVar41 & 0xffff) >> 3) * 3 + ((uVar45 & 0xffff) >> 3);
    uVar40 = uVar40 + ((ushort)(0x520d40 >> ((char)iVar56 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar56 * 0x40 + 0x40;
  }
  local_108->cmd_prefix_ = uVar40;
  *num_literals = *num_literals + uVar46;
  position = local_168 + uVar31;
  uVar22 = sVar48;
  if (position < sVar48) {
    uVar22 = position;
  }
  uVar19 = uVar31 + 2;
  if (local_100 < local_168 >> 2) {
    uVar32 = position + local_100 * -4;
    if (uVar32 < uVar19) {
      uVar32 = uVar19;
    }
    uVar19 = uVar32;
    if (uVar22 < uVar32) {
      uVar19 = uVar22;
    }
  }
  local_188 = uVar31 + lVar49 + local_168 * 2;
  local_108 = local_108 + 1;
  if (uVar22 <= uVar19) {
    local_130 = 0;
    goto LAB_01d010bd;
  }
  pvVar8 = (hasher->privat)._H40.extra[0];
  pvVar9 = (hasher->privat)._H40.extra[1];
  uVar44 = (hasher->privat)._H42.free_slot_idx[0];
  do {
    uVar41 = (uint)(*(int *)(ringbuffer + (uVar19 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar32 = (ulong)uVar41;
    uVar46 = uVar19 - *(uint *)((long)pvVar8 + uVar32 * 4);
    *(char *)((long)pvVar8 + (uVar19 & 0xffff) + 0x30000) = (char)uVar41;
    if (0xfffe < uVar46) {
      uVar46 = 0xffff;
    }
    uVar39 = uVar44 + 1;
    *(short *)((long)pvVar9 + (ulong)uVar44 * 4) = (short)uVar46;
    *(undefined2 *)((long)pvVar9 + (ulong)uVar44 * 4 + 2) =
         *(undefined2 *)((long)pvVar8 + uVar32 * 2 + 0x20000);
    *(int *)((long)pvVar8 + uVar32 * 4) = (int)uVar19;
    *(ushort *)((long)pvVar8 + uVar32 * 2 + 0x20000) = uVar44;
    uVar19 = uVar19 + 1;
    uVar44 = uVar39;
  } while (uVar22 != uVar19);
  local_130 = 0;
  goto LAB_01d01099;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}